

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugLoc::dump
          (DWARFDebugLoc *this,raw_ostream *OS,MCRegisterInfo *MRI,DIDumpOptions DumpOpts,
          Optional<unsigned_long> Offset)

{
  void *__n;
  char *pcVar1;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  LocationList *pLVar2;
  ulong uVar3;
  size_t sVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  long lVar5;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  format_object_base local_50;
  uint64_t local_40;
  MCRegisterInfo *local_38;
  
  local_38 = MRI;
  if (((undefined1  [16])Offset.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar3 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                   super_SmallVectorBase.Size;
    if (uVar3 != 0) {
      pLVar2 = (LocationList *)
               (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
               super_SmallVectorBase.BeginX;
      lVar5 = uVar3 * 0x68;
      do {
        local_50.Fmt = "0x%8.8lx: ";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_01077fc8;
        local_40 = pLVar2->Offset;
        raw_ostream::operator<<(OS,&local_50);
        sVar4 = (size_t)this->IsLittleEndian;
        DumpOpts_01._8_8_ = local_50.Fmt;
        DumpOpts_01._0_8_ = local_50._vptr_format_object_base;
        DumpOpts_01.ShowChildren = (bool)(undefined1)local_40;
        DumpOpts_01.ShowParents = (bool)local_40._1_1_;
        DumpOpts_01.ShowForm = (bool)local_40._2_1_;
        DumpOpts_01.SummarizeTypes = (bool)local_40._3_1_;
        DumpOpts_01.Verbose = (bool)local_40._4_1_;
        DumpOpts_01.DisplayRawContents = (bool)local_40._5_1_;
        DumpOpts_01._22_2_ = local_40._6_2_;
        LocationList::dump(pLVar2,OS,0,this->IsLittleEndian,this->AddressSize,local_38,
                           (DWARFUnit *)0x0,DumpOpts_01,0xc);
        if (OS->OutBufEnd == OS->OutBufCur) {
          raw_ostream::write(OS,0xe3236f,(void *)0x1,sVar4);
          __buf = extraout_RDX_00;
        }
        else {
          *OS->OutBufCur = '\n';
          OS->OutBufCur = OS->OutBufCur + 1;
          __buf = extraout_RDX;
        }
        uVar3 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                       super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                       super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                       super_SmallVectorBase.Size;
        if (uVar3 == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0xab,
                        "const_reference llvm::SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList>::back() const [T = llvm::DWARFDebugLoc::LocationList]"
                       );
        }
        __n = (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
              super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
              super_SmallVectorBase.BeginX;
        if (pLVar2 != (LocationList *)((long)__n + uVar3 * 0x68 + -0x68)) {
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(OS,10,__buf,(size_t)__n);
          }
        }
        pLVar2 = pLVar2 + 1;
        lVar5 = lVar5 + -0x68;
      } while (lVar5 != 0);
    }
  }
  else {
    pLVar2 = getLocationListAtOffset(this,Offset.Storage.field_0.value);
    if (pLVar2 != (LocationList *)0x0) {
      local_50.Fmt = "0x%8.8lx: ";
      local_50._vptr_format_object_base = (_func_int **)&PTR_home_01077fc8;
      local_40 = pLVar2->Offset;
      raw_ostream::operator<<(OS,&local_50);
      sVar4 = (size_t)this->IsLittleEndian;
      DumpOpts_00._8_8_ = uStack_60;
      DumpOpts_00._0_8_ = local_68;
      DumpOpts_00._16_8_ = local_58;
      LocationList::dump(pLVar2,OS,0,this->IsLittleEndian,this->AddressSize,local_38,
                         (DWARFUnit *)0x0,DumpOpts_00,0xc);
      if (OS->OutBufEnd == OS->OutBufCur) {
        raw_ostream::write(OS,0xe3236f,(void *)0x1,sVar4);
      }
      else {
        *OS->OutBufCur = '\n';
        OS->OutBufCur = OS->OutBufCur + 1;
      }
    }
  }
  return;
}

Assistant:

void DWARFDebugLoc::dump(raw_ostream &OS, const MCRegisterInfo *MRI, DIDumpOptions DumpOpts,
                         Optional<uint64_t> Offset) const {
  auto DumpLocationList = [&](const LocationList &L) {
    OS << format("0x%8.8" PRIx64 ": ", L.Offset);
    L.dump(OS, 0, IsLittleEndian, AddressSize, MRI, nullptr, DumpOpts, 12);
    OS << "\n";
  };

  if (Offset) {
    if (auto *L = getLocationListAtOffset(*Offset))
      DumpLocationList(*L);
    return;
  }

  for (const LocationList &L : Locations) {
    DumpLocationList(L);
    if (&L != &Locations.back())
      OS << '\n';
  }
}